

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O3

vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
* hevc_extract_priv_data
            (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *__return_storage_ptr__,uint8_t *buff,int size,uint8_t *nal_size)

{
  pointer *ppvVar1;
  pointer *ppuVar2;
  byte bVar3;
  iterator __position;
  pointer pvVar4;
  iterator __position_00;
  uint16_t uVar5;
  ushort uVar6;
  undefined4 *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ushort *puVar12;
  ushort *puVar13;
  ushort *puVar14;
  ostringstream ss;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  *nal_size = '\x04';
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0x16 < size) {
    *nal_size = (buff[0x15] & 3) + 1;
    bVar3 = buff[0x16];
    if (bVar3 != 0) {
      puVar14 = (ushort *)(buff + (uint)size);
      uVar9 = 0;
      puVar12 = (ushort *)(buff + 0x17);
      do {
        puVar13 = (ushort *)((long)puVar12 + 3);
        if (puVar14 < puVar13) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Invalid HEVC extra data format",0x1e);
          puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar7 = 0x3b6;
          *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
          if (local_1c8 == &local_1b8) {
            puVar7[6] = local_1b8;
            puVar7[7] = uStack_1b4;
            puVar7[8] = uStack_1b0;
            puVar7[9] = uStack_1ac;
          }
          else {
            *(uint **)(puVar7 + 2) = local_1c8;
            *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1b4,local_1b8);
          }
          *(undefined8 *)(puVar7 + 4) = local_1c0;
          local_1c0 = 0;
          local_1b8 = local_1b8 & 0xffffff00;
          local_1c8 = &local_1b8;
          __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        uVar5 = AV_RB16((uint8_t *)((long)puVar12 + 1));
        if (uVar5 != 0) {
          uVar8 = 0;
          do {
            puVar12 = puVar13 + 1;
            if (puVar14 < puVar12) {
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid HEVC extra data format",0x1e);
              puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar7 = 0x3b6;
              *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
              if (local_1e8 == &local_1d8) {
                puVar7[6] = local_1d8;
                puVar7[7] = uStack_1d4;
                puVar7[8] = uStack_1d0;
                puVar7[9] = uStack_1cc;
              }
              else {
                *(uint **)(puVar7 + 2) = local_1e8;
                *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1d4,local_1d8);
              }
              *(undefined8 *)(puVar7 + 4) = local_1e0;
              local_1e0 = 0;
              local_1d8 = local_1d8 & 0xffffff00;
              local_1e8 = &local_1d8;
              __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            uVar6 = *puVar13 << 8 | *puVar13 >> 8;
            uVar11 = (ulong)uVar6;
            if (puVar14 < (ushort *)((long)puVar12 + uVar11)) {
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid HEVC extra data format",0x1e);
              puVar7 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar7 = 0x3b6;
              *(undefined4 **)(puVar7 + 2) = puVar7 + 6;
              if (local_208 == &local_1f8) {
                puVar7[6] = local_1f8;
                puVar7[7] = uStack_1f4;
                puVar7[8] = uStack_1f0;
                puVar7[9] = uStack_1ec;
              }
              else {
                *(uint **)(puVar7 + 2) = local_208;
                *(ulong *)(puVar7 + 6) = CONCAT44(uStack_1f4,local_1f8);
              }
              *(undefined8 *)(puVar7 + 4) = local_200;
              local_1f8 = local_1f8 & 0xffffff00;
              __cxa_throw(puVar7,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            puVar13 = puVar12;
            if (uVar6 != 0) {
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::_M_realloc_insert<>(__return_storage_ptr__,__position);
              }
              else {
                ((__position._M_current)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                ((__position._M_current)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                ((__position._M_current)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ppvVar1 = &(__return_storage_ptr__->
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar1 = *ppvVar1 + 1;
              }
              do {
                pvVar4 = (__return_storage_ptr__->
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                __position_00._M_current =
                     pvVar4[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    pvVar4[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pvVar4 + -1),
                             __position_00,(uchar *)puVar12);
                }
                else {
                  *__position_00._M_current = (uchar)*puVar12;
                  ppuVar2 = &pvVar4[-1].
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppuVar2 = *ppuVar2 + 1;
                }
                puVar13 = (ushort *)((long)puVar12 + 1);
                uVar10 = (int)uVar11 - 1;
                uVar11 = (ulong)uVar10;
                puVar12 = puVar13;
              } while (uVar10 != 0);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar5);
        }
        uVar9 = uVar9 + 1;
        puVar12 = puVar13;
      } while (uVar9 != bVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<uint8_t>> hevc_extract_priv_data(const uint8_t* buff, int size, uint8_t* nal_size)
{
    *nal_size = 4;

    vector<vector<uint8_t>> spsPps;
    if (size < 23)
        return spsPps;

    *nal_size = (buff[21] & 3) + 1;
    int num_arrays = buff[22];

    const uint8_t* src = buff + 23;
    const uint8_t* end = buff + size;
    for (int i = 0; i < num_arrays; ++i)
    {
        if (src + 3 > end)
            THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
        src++;  // type
        int cnt = AV_RB16(src);
        src += 2;

        for (int j = 0; j < cnt; ++j)
        {
            if (src + 2 > end)
                THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
            int nalSize = (src[0] << 8) + src[1];
            src += 2;
            if (src + nalSize > end)
                THROW(ERR_MOV_PARSE, "Invalid HEVC extra data format")
            if (nalSize > 0)
            {
                spsPps.emplace_back();
                for (int k = 0; k < nalSize; ++k, ++src) spsPps.rbegin()->push_back(*src);
            }
        }
    }

    return spsPps;
}